

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O2

bool __thiscall OSToken::setSOPIN(OSToken *this,ByteString *soPINBlob)

{
  undefined1 uVar1;
  int iVar2;
  OSAttribute soPIN;
  ulong local_b8;
  OSAttribute local_b0;
  
  if (this->valid == true) {
    OSAttribute::OSAttribute(&local_b0,soPINBlob);
    iVar2 = (*(this->tokenObject->super_OSObject)._vptr_OSObject[8])
                      (this->tokenObject,0x8000534c,&local_b0);
    if (((char)iVar2 == '\0') ||
       (iVar2 = (*(this->super_ObjectStoreToken)._vptr_ObjectStoreToken[4])(this,&local_b8),
       (char)iVar2 == '\0')) {
      uVar1 = 0;
    }
    else {
      local_b8 = local_b8 & 0xffffffffff0fffff;
      iVar2 = (*(this->super_ObjectStoreToken)._vptr_ObjectStoreToken[5])(this);
      uVar1 = (undefined1)iVar2;
    }
    OSAttribute::~OSAttribute(&local_b0);
    return (bool)uVar1;
  }
  return false;
}

Assistant:

bool OSToken::setSOPIN(const ByteString& soPINBlob)
{
	if (!valid) return false;

	OSAttribute soPIN(soPINBlob);

	CK_ULONG flags;

	if (tokenObject->setAttribute(CKA_OS_SOPIN, soPIN) &&
	    getTokenFlags(flags))
	{
		flags &= ~CKF_SO_PIN_COUNT_LOW;
		flags &= ~CKF_SO_PIN_FINAL_TRY;
		flags &= ~CKF_SO_PIN_LOCKED;
		flags &= ~CKF_SO_PIN_TO_BE_CHANGED;

		return setTokenFlags(flags);
	}

	return false;
}